

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O0

wb_node * node_new(void *key)

{
  wb_node *pwVar1;
  wb_node *node;
  void *key_local;
  
  pwVar1 = (wb_node *)(*dict_malloc_func)(0x30);
  if (pwVar1 != (wb_node *)0x0) {
    pwVar1->key = key;
    pwVar1->datum = (void *)0x0;
    pwVar1->parent = (wb_node *)0x0;
    pwVar1->llink = (wb_node *)0x0;
    pwVar1->rlink = (wb_node *)0x0;
    pwVar1->weight = 2;
  }
  return pwVar1;
}

Assistant:

static wb_node*
node_new(void* key)
{
    wb_node* node = MALLOC(sizeof(*node));
    if (node) {
	node->key = key;
	node->datum = NULL;
	node->parent = NULL;
	node->llink = NULL;
	node->rlink = NULL;
	node->weight = 2;
    }
    return node;
}